

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

void __thiscall
embree::TokenStream::TokenStream
          (TokenStream *this,Ref<embree::Stream<int>_> *cin,string *alpha,string *seps,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *symbols)

{
  Stream<int> *pSVar1;
  
  Stream<embree::Token>::Stream(&this->super_Stream<embree::Token>);
  (this->super_Stream<embree::Token>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__TokenStream_002aa310;
  pSVar1 = cin->ptr;
  (this->cin).ptr = pSVar1;
  if (pSVar1 != (Stream<int> *)0x0) {
    (*(pSVar1->super_RefCount)._vptr_RefCount[2])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->symbols,symbols);
  createCharMap(this->isAlphaMap,alpha);
  createCharMap(this->isSepMap,seps);
  createCharMap(this->isStringCharMap,(string *)stringChars_abi_cxx11_);
  return;
}

Assistant:

TokenStream::TokenStream(const Ref<Stream<int> >& cin,            //< stream to read from
                                   const std::string& alpha,                //< valid characters for identifiers
                                   const std::string& seps,                 //< characters that act as separators
                                   const std::vector<std::string>& symbols) //< symbols
    : cin(cin), symbols(symbols)
  {
    createCharMap(isAlphaMap,alpha);
    createCharMap(isSepMap,seps);
    createCharMap(isStringCharMap,stringChars);
  }